

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O2

uint64_t filemgr_flush_immutable(filemgr *file,err_log_callback *log_callback)

{
  fdb_status io_error;
  uint64_t uVar1;
  
  if ((0 < global_config.ncacheblock) &&
     ((file->io_in_prog).super___atomic_base<unsigned_char>._M_i == '\0')) {
    uVar1 = bcache_get_num_immutable(file);
    if (uVar1 != 0) {
      io_error = bcache_flush_immutable(file);
      if (io_error != FDB_RESULT_SUCCESS) {
        _log_errno_str(file->ops,log_callback,io_error,"WRITE",file->filename);
      }
      uVar1 = bcache_get_num_immutable(file);
      return uVar1;
    }
  }
  return 0;
}

Assistant:

uint64_t filemgr_flush_immutable(struct filemgr *file,
                                   err_log_callback *log_callback)
{
    uint64_t ret = 0;
    if (global_config.ncacheblock > 0) {
        if (atomic_get_uint8_t(&file->io_in_prog)) {
            return 0;
        }
        ret = bcache_get_num_immutable(file);
        if (!ret) {
            return ret;
        }
        fdb_status rv = bcache_flush_immutable(file);
        if (rv != FDB_RESULT_SUCCESS) {
            _log_errno_str(file->ops, log_callback, (fdb_status)rv, "WRITE",
                           file->filename);
        }
        return bcache_get_num_immutable(file);
    }

    return ret;
}